

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddColumn(Parse *pParse,Token *pName,Token *pType)

{
  Column *pCol;
  Table *pTVar1;
  sqlite3 *db;
  Column *pCVar2;
  undefined4 uVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  char *z;
  RenameToken *pRVar7;
  Column *pCVar8;
  size_t sVar9;
  ulong uVar10;
  short sVar11;
  long lVar12;
  char *pcVar13;
  
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    db = pParse->db;
    if (db->aLimit[2] <= (int)pTVar1->nCol) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar1->zName);
      return;
    }
    z = (char *)sqlite3DbMallocRawNN(db,(ulong)(pName->n + pType->n + 2));
    if (z != (char *)0x0) {
      if ((1 < pParse->eParseMode) &&
         (pRVar7 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20), pRVar7 != (RenameToken *)0x0
         )) {
        pRVar7->p = z;
        uVar5 = pName->n;
        uVar3 = *(undefined4 *)&pName->field_0xc;
        (pRVar7->t).z = pName->z;
        (pRVar7->t).n = uVar5;
        *(undefined4 *)&(pRVar7->t).field_0xc = uVar3;
        pRVar7->pNext = pParse->pRename;
        pParse->pRename = pRVar7;
      }
      memcpy(z,pName->z,(ulong)pName->n);
      z[pName->n] = '\0';
      sqlite3Dequote(z);
      sVar11 = pTVar1->nCol;
      uVar5 = (uint)sVar11;
      if (0 < sVar11) {
        pCVar8 = pTVar1->aCol;
        lVar12 = 0;
        do {
          pcVar13 = *(char **)((long)&pCVar8->zName + lVar12);
          if ((pcVar13 != (char *)0x0) && (iVar6 = sqlite3StrICmp(z,pcVar13), iVar6 == 0)) {
            sqlite3ErrorMsg(pParse,"duplicate column name: %s",z);
            goto LAB_0015bdb3;
          }
          lVar12 = lVar12 + 0x20;
        } while ((ulong)uVar5 << 5 != lVar12);
      }
      pCVar8 = pTVar1->aCol;
      if ((uVar5 & 7) == 0) {
        pCVar8 = (Column *)sqlite3DbRealloc(db,pCVar8,(long)(int)uVar5 * 0x20 + 0x100);
        if (pCVar8 == (Column *)0x0) {
LAB_0015bdb3:
          sqlite3DbFreeNN(db,z);
          return;
        }
        pTVar1->aCol = pCVar8;
        sVar11 = pTVar1->nCol;
      }
      pCol = pCVar8 + sVar11;
      pCVar8[sVar11].pDflt = (Expr *)0x0;
      (&pCVar8[sVar11].pDflt)[1] = (Expr *)0x0;
      pCVar2 = pCVar8 + sVar11;
      pCVar2->notNull = '\0';
      pCVar2->affinity = '\0';
      pCVar2->szEst = '\0';
      pCVar2->colFlags = '\0';
      *(undefined4 *)&pCVar2->field_0x1c = 0;
      pCVar8[sVar11].zName = z;
      uVar5 = pType->n;
      if ((ulong)uVar5 == 0) {
        pCol->szEst = '\x01';
        cVar4 = 'A';
      }
      else {
        sVar9 = strlen(z);
        uVar10 = (ulong)((uint)sVar9 & 0x3fffffff);
        pcVar13 = z + uVar10 + 1;
        memcpy(pcVar13,pType->z,(ulong)uVar5);
        z[(ulong)pType->n + 1 + uVar10] = '\0';
        sqlite3Dequote(pcVar13);
        cVar4 = sqlite3AffinityType(pcVar13,pCol);
        pCol->colFlags = pCol->colFlags | 4;
      }
      pCol->affinity = cVar4;
      pTVar1->nCol = pTVar1->nCol + 1;
      (pParse->constraintName).n = 0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName, Token *pType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  z = sqlite3DbMallocRaw(db, pName->n + pType->n + 2);
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, pName);
  memcpy(z, pName->z, pName->n);
  z[pName->n] = 0;
  sqlite3Dequote(z);
  for(i=0; i<p->nCol; i++){
    if( sqlite3_stricmp(z, p->aCol[i].zName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
  sqlite3ColumnPropertiesFromName(p, pCol);
 
  if( pType->n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = SQLITE_AFF_BLOB;
    pCol->szEst = 1;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( 4>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, pType->z, pType->n);
    zType[pType->n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  pParse->constraintName.n = 0;
}